

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_number_table.cpp
# Opt level: O0

size_t __thiscall spvtools::opt::ValueTableHash::operator()(ValueTableHash *this,Instruction *inst)

{
  uint uVar1;
  char32_t cVar2;
  uint32_t uVar3;
  size_t sVar4;
  hash<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  local_65;
  char32_t local_64;
  const_iterator puStack_60;
  uint32_t word;
  const_iterator __end3;
  const_iterator __begin3;
  OperandData *__range3;
  Operand *opnd;
  undefined1 local_38 [4];
  uint32_t i;
  u32string h;
  Instruction *inst_local;
  ValueTableHash *this_local;
  
  h.field_2._8_8_ = inst;
  std::__cxx11::u32string::u32string((u32string *)local_38);
  cVar2 = opt::Instruction::opcode((Instruction *)h.field_2._8_8_);
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  push_back((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
            local_38,cVar2);
  cVar2 = opt::Instruction::type_id((Instruction *)h.field_2._8_8_);
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  push_back((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
            local_38,cVar2);
  opnd._4_4_ = 0;
  while( true ) {
    uVar1 = opnd._4_4_;
    uVar3 = opt::Instruction::NumInOperands((Instruction *)h.field_2._8_8_);
    if (uVar3 <= uVar1) break;
    __range3 = (OperandData *)
               opt::Instruction::GetInOperand((Instruction *)h.field_2._8_8_,opnd._4_4_);
    __begin3 = (const_iterator)&((Operand *)__range3)->words;
    __end3 = utils::SmallVector<unsigned_int,_2UL>::begin
                       ((SmallVector<unsigned_int,_2UL> *)__begin3);
    puStack_60 = utils::SmallVector<unsigned_int,_2UL>::end
                           ((SmallVector<unsigned_int,_2UL> *)__begin3);
    for (; __end3 != puStack_60; __end3 = __end3 + 1) {
      local_64 = *__end3;
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      push_back((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                local_38,local_64);
    }
    opnd._4_4_ = opnd._4_4_ + 1;
  }
  sVar4 = std::
          hash<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
          ::operator()(&local_65,(u32string *)local_38);
  std::__cxx11::u32string::~u32string((u32string *)local_38);
  return sVar4;
}

Assistant:

std::size_t ValueTableHash::operator()(const Instruction& inst) const {
  // We hash the opcode and in-operands, not the result, because we want
  // instructions that are the same except for the result to hash to the
  // same value.
  std::u32string h;
  h.push_back(uint32_t(inst.opcode()));
  h.push_back(inst.type_id());
  for (uint32_t i = 0; i < inst.NumInOperands(); ++i) {
    const auto& opnd = inst.GetInOperand(i);
    for (uint32_t word : opnd.words) {
      h.push_back(word);
    }
  }
  return std::hash<std::u32string>()(h);
}